

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MapFieldGenerator::GenerateByteSize
          (MapFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "total_size += $tag_size$ *\n    ::google::protobuf::internal::FromIntSize(this->$name$_size());\n{\n  ::google::protobuf::scoped_ptr<$map_classname$> entry;\n  for (::google::protobuf::Map< $key_cpp$, $val_cpp$ >::const_iterator\n      it = this->$name$().begin();\n      it != this->$name$().end(); ++it) {\n"
                    );
  if (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x30) + 0xa0) + 0xa7) == '\x01') {
    io::Printer::Print(printer,variables,
                       "    if (entry.get() != NULL && entry->GetArena() != NULL) {\n      entry.release();\n    }\n"
                      );
  }
  io::Printer::Print(printer,variables,
                     "    entry.reset($name$_.New$wrapper$(it->first, it->second));\n    total_size += ::google::protobuf::internal::WireFormatLite::\n        $declared_type$SizeNoVirtual(*entry);\n  }\n"
                    );
  if (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x30) + 0xa0) + 0xa7) == '\x01') {
    io::Printer::Print(printer,variables,
                       "  if (entry.get() != NULL && entry->GetArena() != NULL) {\n    entry.release();\n  }\n"
                      );
  }
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void MapFieldGenerator::
GenerateByteSize(io::Printer* printer) const {
  printer->Print(variables_,
      "total_size += $tag_size$ *\n"
      "    ::google::protobuf::internal::FromIntSize(this->$name$_size());\n"
      "{\n"
      "  ::google::protobuf::scoped_ptr<$map_classname$> entry;\n"
      "  for (::google::protobuf::Map< $key_cpp$, $val_cpp$ >::const_iterator\n"
      "      it = this->$name$().begin();\n"
      "      it != this->$name$().end(); ++it) {\n");

  // If entry is allocated by arena, its desctructor should be avoided.
  if (SupportsArenas(descriptor_)) {
    printer->Print(variables_,
        "    if (entry.get() != NULL && entry->GetArena() != NULL) {\n"
        "      entry.release();\n"
        "    }\n");
  }

  printer->Print(variables_,
      "    entry.reset($name$_.New$wrapper$(it->first, it->second));\n"
      "    total_size += ::google::protobuf::internal::WireFormatLite::\n"
      "        $declared_type$SizeNoVirtual(*entry);\n"
      "  }\n");

  // If entry is allocated by arena, its desctructor should be avoided.
  if (SupportsArenas(descriptor_)) {
    printer->Print(variables_,
        "  if (entry.get() != NULL && entry->GetArena() != NULL) {\n"
        "    entry.release();\n"
        "  }\n");
  }

  printer->Print("}\n");
}